

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZHelpers.cpp
# Opt level: O3

bool s_send_raw(socket_t *socket,string_view payload,int flags)

{
  void *__dest;
  ssize_t sVar1;
  int iVar2;
  undefined4 in_register_0000000c;
  size_t size_;
  int in_R8D;
  message_t message;
  zmq_msg_t local_60;
  
  size_ = payload._M_len;
  iVar2 = flags;
  zmq::message_t::message_t((message_t *)&local_60,size_);
  if (size_ != 0) {
    __dest = zmq_msg_data(&local_60);
    memcpy(__dest,payload._M_str,size_);
  }
  sVar1 = zmq::detail::socket_base::send
                    (&socket->super_socket_base,(int)&local_60,(void *)(ulong)(uint)flags,
                     CONCAT44(in_register_0000000c,iVar2),in_R8D);
  zmq_msg_close(&local_60);
  return (bool)(char)sVar1;
}

Assistant:

bool s_send_raw(zmq::socket_t *socket, std::string_view payload,
                int flags = 0) {
    zmq::message_t message(payload.size());
    if (payload.size()) {
        ::memcpy(message.data(), payload.data(), payload.size());
    }
    return socket->send(message, flags);
}